

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sort_tree.hpp
# Opt level: O1

void __thiscall
duckdb::
MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
::BuildRun(MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
           *this,idx_t level_idx,idx_t run_idx)

{
  ulong uVar1;
  value_type vVar2;
  _Head_base<1UL,_unsigned_long,_false> _Var3;
  MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
  *this_00;
  reference pvVar4;
  unsigned_long uVar5;
  reference pvVar6;
  reference pvVar7;
  const_reference pvVar8;
  ulong uVar9;
  ulong uVar10;
  size_type __n;
  pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *__s;
  long lVar11;
  ulong *puVar12;
  size_type sVar13;
  ulong uVar14;
  RunElement *insert_val;
  ulong uVar15;
  vector<unsigned_long,_true> *this_01;
  size_type sVar16;
  unsigned_long uVar17;
  size_type sVar18;
  long lVar19;
  bool bVar20;
  array<std::pair<unsigned_long,_unsigned_long>,_32UL> bounds;
  Games games;
  RunElements players;
  RunElement local_8c8;
  reference local_8b0;
  RunElement local_8a8;
  size_type local_890;
  MergeSortTree<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long,_std::less<std::tuple<unsigned_long,_unsigned_long>_>,_32UL,_32UL>
  *local_888;
  ulong local_880;
  ulong local_878;
  reference local_870;
  ulong local_868;
  reference local_860;
  RunElement local_858;
  RunElement local_838;
  value_type local_818;
  ulong local_810 [63];
  Games local_618;
  RunElements local_330;
  
  local_888 = this;
  pvVar4 = vector<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
           ::operator[](&this->tree,level_idx);
  local_8b0 = vector<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
              ::operator[](&this->tree,level_idx);
  __n = level_idx - 1;
  local_870 = vector<std::pair<duckdb::vector<std::tuple<unsigned_long,_unsigned_long>,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
              ::operator[](&this->tree,__n);
  if (level_idx < 2) {
    local_880 = 1;
    uVar15 = 0x20;
  }
  else {
    uVar15 = 0x20;
    do {
      local_880 = uVar15;
      uVar15 = local_880 << 5;
      __n = __n - 1;
    } while (__n != 0);
  }
  this_01 = &local_8b0->second;
  local_878 = (long)(pvVar4->first).
                    super_vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                    .
                    super__Vector_base<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pvVar4->first).
                    super_vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                    .
                    super__Vector_base<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
  local_8a8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
  super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl.
  _0_4_ = 0xffffffff;
  local_8a8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
  super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl.
  _4_4_ = 0xffffffff;
  local_8a8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._0_4_ = 0xffffffff;
  local_8a8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._4_4_ = 0xffffffff;
  local_8a8.second = 0xffffffffffffffff;
  uVar17 = 0;
  local_860 = pvVar4;
  switchD_01306cb1::default(&local_818,0,0x200);
  __s = local_330._M_elems;
  switchD_01306cb1::default(__s,0,0x300);
  local_890 = uVar15 * run_idx;
  puVar12 = local_810;
  uVar10 = local_878;
  sVar18 = local_890;
  uVar14 = local_880;
  local_868 = uVar15;
  do {
    uVar15 = uVar10;
    if (sVar18 < uVar10) {
      uVar15 = sVar18;
    }
    uVar1 = uVar14 + sVar18;
    uVar9 = uVar10;
    if (uVar1 < uVar10) {
      uVar9 = uVar1;
    }
    puVar12[-1] = uVar15;
    *puVar12 = uVar9;
    if (uVar15 == uVar9) {
      _Var3._M_head_impl._4_4_ =
           local_8a8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
           super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
           _M_head_impl._4_4_;
      _Var3._M_head_impl._0_4_ =
           (undefined4)
           local_8a8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
           super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
           _M_head_impl;
      (((pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *)&__s->first)->first).
      super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<1UL,_unsigned_long>.
      super__Head_base<1UL,_unsigned_long,_false>._M_head_impl = _Var3._M_head_impl;
      (((pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *)&__s->first)->first).
      super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
      super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
           CONCAT44(local_8a8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                    super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._4_4_,
                    (undefined4)
                    local_8a8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                    super__Head_base<0UL,_unsigned_long,_false>._M_head_impl);
      uVar5 = local_8a8.second;
    }
    else {
      pvVar8 = vector<std::tuple<unsigned_long,_unsigned_long>,_true>::operator[]
                         (&local_870->first,sVar18);
      uVar5 = (pvVar8->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
              super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
      (((pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *)&__s->first)->first).
      super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<1UL,_unsigned_long>.
      super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
           (pvVar8->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
           super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
           _M_head_impl;
      (((pair<std::tuple<unsigned_long,_unsigned_long>,_unsigned_long> *)&__s->first)->first).
      super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
      super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = uVar5;
      uVar5 = uVar17;
      uVar10 = local_878;
      uVar14 = local_880;
    }
    __s->second = uVar5;
    uVar17 = uVar17 + 1;
    __s = __s + 1;
    puVar12 = puVar12 + 2;
    sVar18 = uVar1;
  } while (uVar17 != 0x20);
  switchD_01306cb1::default(&local_618,0,0x2e8);
  this_00 = local_888;
  sVar16 = run_idx * ((local_868 >> 5) + 2) * 0x20;
  StartGames(&local_8c8,local_888,&local_618,&local_330,&local_8a8);
  sVar18 = local_890;
  if ((local_8c8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
       super__Head_base<0UL,_unsigned_long,_false>._M_head_impl ==
       CONCAT44(local_8a8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._4_4_,
                (undefined4)
                local_8a8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                super__Head_base<0UL,_unsigned_long,_false>._M_head_impl)) &&
     (local_8c8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
      super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl
      == (_Head_base<1UL,_unsigned_long,_false>)
         CONCAT44(local_8a8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                  super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
                  _M_head_impl._4_4_,
                  (undefined4)
                  local_8a8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                  super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
                  _M_head_impl))) goto LAB_011e4eb4;
  do {
    do {
      if (((local_8b0->second).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start !=
           (local_8b0->second).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish) && ((sVar18 & 0x1f) == 0)) {
        lVar11 = 0;
        sVar13 = sVar16;
        do {
          vVar2 = *(value_type *)((long)local_810 + lVar11 + -8);
          sVar16 = sVar13 + 1;
          pvVar6 = vector<unsigned_long,_true>::operator[](this_01,sVar13);
          *pvVar6 = vVar2;
          lVar11 = lVar11 + 0x10;
          sVar13 = sVar16;
        } while (lVar11 != 0x200);
      }
      pvVar7 = vector<std::tuple<unsigned_long,_unsigned_long>,_true>::operator[]
                         (&local_860->first,sVar18);
      uVar17 = local_8c8.second;
      (pvVar7->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
      super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl
           = (unsigned_long)
             local_8c8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
             super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
             _M_head_impl;
      (pvVar7->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
      super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
           local_8c8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
           super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
      uVar15 = local_810[local_8c8.second * 2 + -1] + 1;
      local_810[local_8c8.second * 2 + -1] = uVar15;
      if (uVar15 < local_810[local_8c8.second * 2]) {
        pvVar8 = vector<std::tuple<unsigned_long,_unsigned_long>,_true>::operator[]
                           (&local_870->first,uVar15);
        local_838.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
        super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
        _M_head_impl = (_Head_base<1UL,_unsigned_long,_false>)
                       (pvVar8->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
                       super__Tuple_impl<1UL,_unsigned_long>.
                       super__Head_base<1UL,_unsigned_long,_false>._M_head_impl;
        local_838.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
        super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
             (pvVar8->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>).
             super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
        insert_val = &local_838;
        local_838.second = uVar17;
      }
      else {
        insert_val = &local_8a8;
      }
      ReplayGames(&local_858,this_00,&local_618,uVar17,insert_val);
      local_8c8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
      super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl
           = local_858.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
             super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
             _M_head_impl;
      local_8c8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
      super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
           local_858.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
           super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
      local_8c8.second = local_858.second;
      sVar18 = sVar18 + 1;
    } while ((local_858.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
              super__Head_base<0UL,_unsigned_long,_false>._M_head_impl !=
              CONCAT44(local_8a8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                       super__Head_base<0UL,_unsigned_long,_false>._M_head_impl._4_4_,
                       (undefined4)
                       local_8a8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                       super__Head_base<0UL,_unsigned_long,_false>._M_head_impl)) ||
            (local_858.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
             super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
             _M_head_impl !=
             (_Head_base<1UL,_unsigned_long,_false>)
             CONCAT44(local_8a8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                      super__Tuple_impl<1UL,_unsigned_long>.
                      super__Head_base<1UL,_unsigned_long,_false>._M_head_impl._4_4_,
                      (undefined4)
                      local_8a8.first.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
                      super__Tuple_impl<1UL,_unsigned_long>.
                      super__Head_base<1UL,_unsigned_long,_false>._M_head_impl)));
LAB_011e4eb4:
  } while (local_8c8.second != local_8a8.second);
  if ((local_8b0->second).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (local_8b0->second).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar11 = 0;
    do {
      lVar19 = 0;
      sVar13 = sVar16;
      do {
        vVar2 = *(value_type *)((long)local_810 + lVar19 + -8);
        sVar16 = sVar13 + 1;
        pvVar6 = vector<unsigned_long,_true>::operator[](this_01,sVar13);
        *pvVar6 = vVar2;
        lVar19 = lVar19 + 0x10;
        sVar13 = sVar16;
      } while (lVar19 != 0x200);
      bVar20 = lVar11 == 0;
      lVar11 = lVar11 + 1;
    } while (bVar20);
  }
  LOCK();
  (local_888->build_complete).super___atomic_base<unsigned_long>._M_i =
       (local_888->build_complete).super___atomic_base<unsigned_long>._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void MergeSortTree<E, O, CMP, F, C>::BuildRun(idx_t level_idx, idx_t run_idx) {
	//	Create each parent run by merging the child runs using a tournament tree
	// 	https://en.wikipedia.org/wiki/K-way_merge_algorithm
	const auto fanout = F;
	const auto cascading = C;

	auto &elements = tree[level_idx].first;
	auto &cascades = tree[level_idx].second;
	const auto &child_level = tree[level_idx - 1];
	const auto count = elements.size();

	idx_t child_run_length = 1;
	auto run_length = child_run_length * fanout;
	for (idx_t l = 1; l < level_idx; ++l) {
		child_run_length = run_length;
		run_length *= fanout;
	}

	const RunElement SENTINEL(MergeSortTraits<ElementType>::SENTINEL(), MergeSortTraits<idx_t>::SENTINEL());

	//	Position markers for scanning the children.
	using Bounds = pair<OffsetType, OffsetType>;
	array<Bounds, fanout> bounds;
	//	Start with first element of each (sorted) child run
	RunElements players;
	const auto child_base = run_idx * run_length;
	for (idx_t child_run = 0; child_run < fanout; ++child_run) {
		const auto child_idx = child_base + child_run * child_run_length;
		bounds[child_run] = {OffsetType(MinValue<idx_t>(child_idx, count)),
		                     OffsetType(MinValue<idx_t>(child_idx + child_run_length, count))};
		if (bounds[child_run].first != bounds[child_run].second) {
			players[child_run] = {child_level.first[child_idx], child_run};
		} else {
			//	Empty child
			players[child_run] = SENTINEL;
		}
	}

	//	Play the first round and extract the winner
	Games games;
	auto element_idx = child_base;
	auto cascade_idx = fanout * run_idx * (run_length / cascading + 2);
	auto winner = StartGames(games, players, SENTINEL);
	while (winner != SENTINEL) {
		// Add fractional cascading pointers
		// if we are on a fraction boundary
		if (!cascades.empty() && element_idx % cascading == 0) {
			for (idx_t i = 0; i < fanout; ++i) {
				cascades[cascade_idx++] = bounds[i].first;
			}
		}

		//	Insert new winner element into the current run
		elements[element_idx++] = winner.first;
		const auto child_run = winner.second;
		auto &child_idx = bounds[child_run].first;
		++child_idx;

		//	Move to the next entry in the child run (if any)
		if (child_idx < bounds[child_run].second) {
			winner = ReplayGames(games, child_run, {child_level.first[child_idx], child_run});
		} else {
			winner = ReplayGames(games, child_run, SENTINEL);
		}
	}

	// Add terminal cascade pointers to the end
	if (!cascades.empty()) {
		for (idx_t j = 0; j < 2; ++j) {
			for (idx_t i = 0; i < fanout; ++i) {
				cascades[cascade_idx++] = bounds[i].first;
			}
		}
	}

	++build_complete;
}